

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<unsigned_int,_duckdb_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<unsigned_int,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  num_writer f;
  int num_digits;
  _Alloc_hider _Var5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  string_view prefix;
  string groups;
  undefined7 uStack_5f;
  string local_40;
  
  grouping_impl<char>(&local_40,(locale_ref)(this->writer->locale_).locale_);
  if (local_40._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar2 = this->specs->thousands;
    if (cVar2 == '\0') {
      on_dec(this);
    }
    else {
      uVar4 = this->abs_value;
      uVar9 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = (uVar9 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
      iVar10 = (uVar9 + 1) -
               (uint)(uVar4 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar9 * 4
                                       ));
      pcVar1 = local_40._M_dataplus._M_p + local_40._M_string_length;
      iVar11 = (int)local_40._M_string_length + iVar10;
      _Var5._M_p = local_40._M_dataplus._M_p;
      iVar7 = iVar10;
      do {
        cVar3 = *_Var5._M_p;
        iVar8 = iVar7 - cVar3;
        pcVar6 = _Var5._M_p;
        num_digits = iVar10;
        if ((iVar8 == 0 || iVar7 < cVar3) || ((byte)(cVar3 + 0x81U) < 0x82)) break;
        iVar10 = iVar10 + 1;
        _Var5._M_p = _Var5._M_p + 1;
        local_40._M_string_length = local_40._M_string_length - 1;
        pcVar6 = pcVar1;
        iVar7 = iVar8;
        num_digits = iVar11;
      } while (local_40._M_string_length != 0);
      if (pcVar6 == pcVar1) {
        num_digits = (iVar7 + -1) / (int)pcVar1[-1] + num_digits;
      }
      f._17_7_ = uStack_5f;
      f.sep = cVar2;
      f.size = num_digits;
      f.abs_value = uVar4;
      f.groups = &local_40;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      basic_writer<duckdb_fmt::v6::buffer_range<char>>::
      write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<unsigned_int,duckdb_fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<duckdb_fmt::v6::buffer_range<char>> *)this->writer,num_digits,prefix,
                 *this->specs,f);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = specs.thousands;
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, static_cast<char_type>(sep)});
    }